

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  SectionTracker *this_00;
  ITracker *pIVar1;
  allocator local_31;
  string local_30 [32];
  TrackerContext *local_10;
  TrackerContext *this_local;
  
  local_10 = this;
  this_00 = (SectionTracker *)operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"{root}",&local_31);
  SectionTracker::SectionTracker(this_00,(string *)local_30,this,(ITracker *)0x0);
  Ptr<Catch::TestCaseTracking::ITracker>::operator=(&this->m_rootTracker,(ITracker *)this_00);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  pIVar1 = Ptr<Catch::TestCaseTracking::ITracker>::operator*(&this->m_rootTracker);
  return pIVar1;
}

Assistant:

inline ITracker& TrackerContext::startRun() {
			m_rootTracker = new SectionTracker("{root}", *this, CATCH_NULL);
			m_currentTracker = CATCH_NULL;
			m_runState = Executing;
			return *m_rootTracker;
		}